

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O0

bool __thiscall CheckStructure::isType(CheckStructure *this,string *begin)

{
  bool bVar1;
  __type _Var2;
  reference pbVar3;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  int local_68;
  string local_58 [8];
  string str;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *begin_local;
  CheckStructure *this_local;
  
  this->m_coutTypes = this->m_coutTypes + 1;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->types);
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->types);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_38), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_58,(string *)pbVar3);
    _Var2 = std::operator==(begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58);
    if (_Var2) {
      if (this->m_coutTypes == 1) {
        std::__cxx11::string::operator=((string *)this,local_58);
      }
      this_local._7_1_ = 1;
      local_68 = 1;
    }
    else {
      local_68 = 0;
    }
    std::__cxx11::string::~string(local_58);
    if (local_68 != 0) goto LAB_00104e78;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::operator==(begin,"main");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"missed type of main()",&local_89);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_errors,(value_type *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    this->m_countCalls = this->m_countCalls + 1;
    this_local._7_1_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Wrong type of main()",&local_b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_errors,(value_type *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    this->m_fWrongType = true;
    this_local._7_1_ = 0;
  }
LAB_00104e78:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CheckStructure::isType(string begin) {
    m_coutTypes++;
    for (string str : types) {
        if (begin == str) {
            if (m_coutTypes == 1)
                m_sMainType = str;
            return true;
        }
    }
    if (begin == "main") {
        m_errors.push_back("missed type of main()");
        m_countCalls++;
        return false;
    } else {
        m_errors.push_back("Wrong type of main()");
        m_fWrongType = true;
    }
    return false;
}